

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

int secp256k1_fe_cmp_var(secp256k1_fe *a,secp256k1_fe *b)

{
  int local_24;
  int i;
  secp256k1_fe *b_local;
  secp256k1_fe *a_local;
  
  local_24 = 4;
  while( true ) {
    if (local_24 < 0) {
      return 0;
    }
    if (b->n[local_24] < a->n[local_24]) break;
    if (a->n[local_24] < b->n[local_24]) {
      return -1;
    }
    local_24 = local_24 + -1;
  }
  return 1;
}

Assistant:

static int secp256k1_fe_cmp_var(const secp256k1_fe *a, const secp256k1_fe *b) {
    int i;
#ifdef VERIFY
    VERIFY_CHECK(a->normalized);
    VERIFY_CHECK(b->normalized);
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(b);
#endif
    for (i = 4; i >= 0; i--) {
        if (a->n[i] > b->n[i]) {
            return 1;
        }
        if (a->n[i] < b->n[i]) {
            return -1;
        }
    }
    return 0;
}